

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utSharedPPData.cpp
# Opt level: O0

void __thiscall
SharedPPDataTest_testPropertyDeallocation_Test::TestBody
          (SharedPPDataTest_testPropertyDeallocation_Test *this)

{
  bool bVar1;
  TestType *pTVar2;
  char *pcVar3;
  char *in_R9;
  string local_e0;
  AssertHelper local_c0;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar__1;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  AssertHelper local_60;
  Message local_58 [3];
  bool local_39;
  undefined1 local_38 [8];
  AssertionResult gtest_ar_;
  TestType *pip;
  TestType *out;
  SharedPostProcessInfo *localShared;
  SharedPPDataTest_testPropertyDeallocation_Test *this_local;
  
  localShared = (SharedPostProcessInfo *)this;
  pTVar2 = (TestType *)operator_new(0x30);
  *(_Base_ptr *)(pTVar2 + 0x20) = (_Base_ptr)0x0;
  *(size_t *)(pTVar2 + 0x28) = 0;
  *(_Base_ptr *)(pTVar2 + 0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)(pTVar2 + 0x18) = (_Base_ptr)0x0;
  *(undefined8 *)pTVar2 = 0;
  *(undefined8 *)(pTVar2 + 8) = 0;
  Assimp::SharedPostProcessInfo::SharedPostProcessInfo((SharedPostProcessInfo *)pTVar2);
  destructed = false;
  out = pTVar2;
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(1);
  Assimp::SharedPostProcessInfo::AddProperty<TestType>
            ((SharedPostProcessInfo *)out,"quak",(TestType *)gtest_ar_.message_.ptr_);
  local_39 = Assimp::SharedPostProcessInfo::GetProperty<TestType>
                       ((SharedPostProcessInfo *)out,"quak",&pip);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_38,&local_39,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_38,
               (AssertionResult *)"localShared->GetProperty(\"quak\",out)","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSharedPPData.cpp"
               ,0x77,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  testing::internal::EqHelper<false>::Compare<TestType*,TestType*>
            ((EqHelper<false> *)local_90,"pip","out",(TestType **)&gtest_ar_.message_,&pip);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSharedPPData.cpp"
               ,0x78,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  pTVar2 = out;
  if (out != (TestType *)0x0) {
    Assimp::SharedPostProcessInfo::~SharedPostProcessInfo((SharedPostProcessInfo *)out);
    operator_delete(pTVar2);
  }
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b0,&destructed,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e0,(internal *)local_b0,(AssertionResult *)"destructed","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSharedPPData.cpp"
               ,0x7b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  return;
}

Assistant:

TEST_F(SharedPPDataTest, testPropertyDeallocation)
{
	SharedPostProcessInfo* localShared = new SharedPostProcessInfo();
	destructed = false;

	TestType *out, * pip = new TestType();
	localShared->AddProperty("quak",pip);
    EXPECT_TRUE(localShared->GetProperty("quak",out));
    EXPECT_EQ(pip, out);

    delete localShared;
    EXPECT_TRUE(destructed);
}